

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD5Importer::MakeDataUnique(MD5Importer *this,MeshDesc *meshSrc)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  DeadlyImportError *this_00;
  reference pvVar5;
  reference pvVar6;
  reference rVar7;
  float local_f4;
  reference local_e0;
  reference local_d0;
  undefined1 local_ba;
  allocator<char> local_b9;
  string local_b8;
  uint local_94;
  reference paStack_90;
  uint i;
  aiFace *face;
  __normal_iterator<const_aiFace_*,_std::vector<aiFace,_std::allocator<aiFace>_>_> local_80;
  const_iterator iterEnd;
  __normal_iterator<const_aiFace_*,_std::vector<aiFace,_std::allocator<aiFace>_>_> local_70;
  const_iterator iter;
  uint guess;
  float fWeightsPerVert;
  uint iNewIndex;
  uint iNewNum;
  allocator<bool> local_42;
  bool local_41;
  undefined1 local_40 [8];
  vector<bool,_std::allocator<bool>_> abHad;
  MeshDesc *meshSrc_local;
  MD5Importer *this_local;
  
  abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)meshSrc;
  sVar3 = std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::size
                    (&meshSrc->mVertices);
  local_41 = false;
  std::allocator<bool>::allocator(&local_42);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_40,sVar3,&local_41,&local_42);
  std::allocator<bool>::~allocator(&local_42);
  sVar3 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                    ((vector<aiFace,_std::allocator<aiFace>_> *)
                     (abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage + 6));
  uVar1 = (int)sVar3 * 3;
  sVar3 = std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::size
                    ((vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_> *)
                     (abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage + 3));
  guess = (uint)sVar3;
  std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::resize
            ((vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_> *)
             (abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage + 3),(ulong)uVar1);
  sVar4 = std::vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>::size
                    ((vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_> *)
                     abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage);
  local_f4 = (float)sVar4;
  iter._M_current._4_4_ = (uint)(long)((local_f4 / (float)(sVar3 & 0xffffffff)) * (float)uVar1);
  std::vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_>::reserve
            ((vector<Assimp::MD5::WeightDesc,_std::allocator<Assimp::MD5::WeightDesc>_> *)
             abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage,(ulong)(iter._M_current._4_4_ + (iter._M_current._4_4_ >> 3)));
  iterEnd._M_current =
       (aiFace *)
       std::vector<aiFace,_std::allocator<aiFace>_>::begin
                 ((vector<aiFace,_std::allocator<aiFace>_> *)
                  (abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                   ._M_end_of_storage + 6));
  __gnu_cxx::__normal_iterator<aiFace_const*,std::vector<aiFace,std::allocator<aiFace>>>::
  __normal_iterator<aiFace*>
            ((__normal_iterator<aiFace_const*,std::vector<aiFace,std::allocator<aiFace>>> *)
             &local_70,
             (__normal_iterator<aiFace_*,_std::vector<aiFace,_std::allocator<aiFace>_>_> *)&iterEnd)
  ;
  face = (aiFace *)
         std::vector<aiFace,_std::allocator<aiFace>_>::end
                   ((vector<aiFace,_std::allocator<aiFace>_> *)
                    (abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 6));
  __gnu_cxx::__normal_iterator<aiFace_const*,std::vector<aiFace,std::allocator<aiFace>>>::
  __normal_iterator<aiFace*>
            ((__normal_iterator<aiFace_const*,std::vector<aiFace,std::allocator<aiFace>>> *)
             &local_80,
             (__normal_iterator<aiFace_*,_std::vector<aiFace,_std::allocator<aiFace>_>_> *)&face);
  do {
    bVar2 = __gnu_cxx::operator!=(&local_70,&local_80);
    if (!bVar2) {
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_40);
      return;
    }
    paStack_90 = __gnu_cxx::
                 __normal_iterator<const_aiFace_*,_std::vector<aiFace,_std::allocator<aiFace>_>_>::
                 operator*(&local_70);
    for (local_94 = 0; local_94 < 3; local_94 = local_94 + 1) {
      uVar1 = *paStack_90->mIndices;
      sVar3 = std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::size
                        ((vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                          *)(abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage + 3));
      if (sVar3 <= uVar1) {
        local_ba = 1;
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"MD5MESH: Invalid vertex index",&local_b9);
        DeadlyImportError::DeadlyImportError(this_00,&local_b8);
        local_ba = 0;
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_40,
                         (ulong)paStack_90->mIndices[local_94]);
      local_d0 = rVar7;
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_d0);
      if (bVar2) {
        pvVar5 = std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::
                 operator[]((vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                             *)(abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage + 3),
                            (ulong)paStack_90->mIndices[local_94]);
        pvVar6 = std::vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>::
                 operator[]((vector<Assimp::MD5::VertexDesc,_std::allocator<Assimp::MD5::VertexDesc>_>
                             *)(abHad.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage + 3),(ulong)guess);
        pvVar6->mUV = pvVar5->mUV;
        uVar1 = pvVar5->mNumWeights;
        pvVar6->mFirstWeight = pvVar5->mFirstWeight;
        pvVar6->mNumWeights = uVar1;
        paStack_90->mIndices[local_94] = guess;
        guess = guess + 1;
      }
      else {
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_40,
                           (ulong)paStack_90->mIndices[local_94]);
        local_e0 = rVar7;
        std::_Bit_reference::operator=(&local_e0,true);
      }
    }
    std::swap<unsigned_int>(paStack_90->mIndices,paStack_90->mIndices + 2);
    __gnu_cxx::__normal_iterator<const_aiFace_*,_std::vector<aiFace,_std::allocator<aiFace>_>_>::
    operator++(&local_70);
  } while( true );
}

Assistant:

void MD5Importer::MakeDataUnique (MD5::MeshDesc& meshSrc)
{
    std::vector<bool> abHad(meshSrc.mVertices.size(),false);

    // allocate enough storage to keep the output structures
    const unsigned int iNewNum = static_cast<unsigned int>(meshSrc.mFaces.size()*3);
    unsigned int iNewIndex = static_cast<unsigned int>(meshSrc.mVertices.size());
    meshSrc.mVertices.resize(iNewNum);

    // try to guess how much storage we'll need for new weights
    const float fWeightsPerVert = meshSrc.mWeights.size() / (float)iNewIndex;
    const unsigned int guess = (unsigned int)(fWeightsPerVert*iNewNum);
    meshSrc.mWeights.reserve(guess + (guess >> 3)); // + 12.5% as buffer

    for (FaceList::const_iterator iter = meshSrc.mFaces.begin(),iterEnd = meshSrc.mFaces.end();iter != iterEnd;++iter){
        const aiFace& face = *iter;
        for (unsigned int i = 0; i < 3;++i) {
            if (face.mIndices[0] >= meshSrc.mVertices.size()) {
                throw DeadlyImportError("MD5MESH: Invalid vertex index");
            }

            if (abHad[face.mIndices[i]])    {
                // generate a new vertex
                meshSrc.mVertices[iNewIndex] = meshSrc.mVertices[face.mIndices[i]];
                face.mIndices[i] = iNewIndex++;
            }
            else abHad[face.mIndices[i]] = true;
        }
        // swap face order
        std::swap(face.mIndices[0],face.mIndices[2]);
    }
}